

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void newProcess(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *plVar4;
  _List_node_base *p_Var5;
  ostream *poVar6;
  long lVar7;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range1;
  _List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *__x;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar8;
  int iVar9;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar10;
  __off64_t *in_R8;
  size_t in_R9;
  list<MemBlock*,std::allocator<MemBlock*>> *__x_00;
  uint in_stack_fffffffffffff958;
  int mem;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> __carry;
  char name [50];
  Process *process_1;
  MemBlock *used;
  _List_base<MemBlock_*,_std::allocator<MemBlock_*>_> local_638 [64];
  
  name[0x20] = '\0';
  name[0x21] = '\0';
  name[0x22] = '\0';
  name[0x23] = '\0';
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  name[0x28] = '\0';
  name[0x29] = '\0';
  name[0x2a] = '\0';
  name[0x2b] = '\0';
  name[0x2c] = '\0';
  name[0x2d] = '\0';
  name[0x2e] = '\0';
  name[0x2f] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0x30] = '\0';
  name[0x31] = '\0';
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  mem = 0;
  pcVar2 = strtok((char *)0x0," ");
  if (pcVar2 == (char *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"have no enough args");
    std::endl<char,std::char_traits<char>>(poVar6);
    return;
  }
  strcpy(name,pcVar2);
  pcVar2 = strtok((char *)0x0," ");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "have no enough args";
LAB_00101d65:
    poVar6 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    __isoc99_sscanf(pcVar2,"%d",&mem);
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&__carry;
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node._M_size = 0;
      lVar3 = 0;
      do {
        lVar7 = (long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar3;
        *(long *)((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_prev + lVar3) = lVar7
        ;
        *(long *)lVar7 = lVar7;
        *(undefined8 *)((long)&local_638[0]._M_impl._M_node._M_size + lVar3) = 0;
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0x600);
      plVar10 = (list<MemBlock*,std::allocator<MemBlock*>> *)local_638;
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
      do {
        plVar8 = plVar10;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::splice
                  (&__carry,(int)__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
                                 _M_impl._M_node.super__List_node_base._M_next,
                   (__off64_t *)&freeMemBlockList_abi_cxx11_,
                   (int)freeMemBlockList_abi_cxx11_.
                        super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                        super__List_node_base._M_next,in_R8,in_R9,in_stack_fffffffffffff958);
        for (__x_00 = (list<MemBlock*,std::allocator<MemBlock*>> *)local_638; __x_00 != plVar8;
            __x_00 = __x_00 + 0x18) {
          if (__x_00 == *(list<MemBlock*,std::allocator<MemBlock*>> **)__x_00) {
            lVar3 = 0;
            plVar10 = __x_00;
            goto LAB_00101c4b;
          }
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<newProcess()::__0>
                    (__x_00,&__carry);
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                    (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)__x_00);
        }
        lVar3 = 0x18;
        plVar10 = plVar8;
LAB_00101c4b:
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                  (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar10);
        plVar10 = plVar8 + lVar3;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      plVar10 = (list<MemBlock*,std::allocator<MemBlock*>> *)local_638;
      while (plVar10 = plVar10 + 0x18, plVar10 != plVar8 + lVar3) {
        std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<newProcess()::__0>(plVar10);
      }
      plVar10 = plVar8 + -0x18;
      if (__x_00 == plVar8) {
        plVar10 = plVar8;
      }
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                (&freeMemBlockList_abi_cxx11_,
                 (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar10);
      lVar3 = 0x5e8;
      do {
        std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                  ((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                   ((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                (&__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>);
    }
    iVar9 = mem;
    plVar4 = &freeMemBlockList_abi_cxx11_;
    do {
      plVar4 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
               (plVar4->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl._M_node.
               super__List_node_base._M_next;
      if (plVar4 == &freeMemBlockList_abi_cxx11_) {
        pcVar2 = "can\'t create new process, reason: no enough mem";
        goto LAB_00101d65;
      }
      local_638[0]._M_impl._M_node.super__List_node_base._M_next =
           *(_List_node_base **)((long)plVar4 + 0x10);
    } while (*(int *)((long)&(local_638[0]._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                     4) < mem);
    iVar1 = *(int *)((long)&(local_638[0]._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                    4);
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
              (&freeMemBlockList_abi_cxx11_,(char *)local_638);
    if (iVar9 == iVar1) {
      __x = local_638;
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                (&usedMemBlockList_abi_cxx11_,(value_type *)__x);
      p_Var5 = (_List_node_base *)operator_new(0x40);
      plVar4 = &__carry;
    }
    else {
      p_Var5 = (_List_node_base *)operator_new(8);
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var5;
      used = (MemBlock *)operator_new(8);
      __x = (_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&used;
      iVar9 = *(int *)&(local_638[0]._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      used->start = iVar9;
      used->length = mem;
      iVar9 = mem + iVar9;
      *(int *)&p_Var5->_M_next = iVar9;
      *(int *)((long)&p_Var5->_M_next + 4) =
           (*(int *)&(local_638[0]._M_impl._M_node.super__List_node_base._M_next)->_M_next - iVar9)
           + *(int *)((long)&(local_638[0]._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                     4);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                (&freeMemBlockList_abi_cxx11_,(value_type *)&__carry);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                (&usedMemBlockList_abi_cxx11_,(value_type *)__x);
      operator_delete(local_638[0]._M_impl._M_node.super__List_node_base._M_next);
      p_Var5 = (_List_node_base *)operator_new(0x40);
      plVar4 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&process_1;
    }
    (plVar4->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl._M_node.
    super__List_node_base._M_next = p_Var5;
    pidCount = pidCount + 1;
    *(int *)&p_Var5->_M_next = pidCount;
    strcpy((char *)((long)&p_Var5->_M_next + 4),name);
    p_Var5[3]._M_prev = (__x->_M_impl)._M_node.super__List_node_base._M_next;
    std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::push_back
              (&processList_abi_cxx11_,(value_type *)plVar4);
  }
  return;
}

Assistant:

void newProcess() {
    // 获取参数
    char name[50];
    memset(name, 0, 50);
    int mem = 0;
    char *p;
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    strcpy(name, p);
    p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &mem);

    // 将所有的空闲内存按照从小到大的顺序排序
    freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
        return a->length < b->length;
    });

    // 寻找一块最合适的内存
    MemBlock *bestFit = nullptr;
    for (MemBlock *i : freeMemBlockList)
        if (mem <= i->length) {
            bestFit = i;
            break;
        }
    if (bestFit) {
        // 如果这一块内存刚好跟目标大小一样大
        if (mem == bestFit->length) {
            // 从空闲区域移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之添加到已经使用区域
            usedMemBlockList.push_back(bestFit);
            // 创建一个新的进程描述d
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = bestFit;
            // 将进程描述添加到进程表中
            processList.push_back(process);
            // 否则
        } else {
            // 从空闲区移出原来的元素
            freeMemBlockList.remove(bestFit);
            // 将之划分成两份
            MemBlock *free = new MemBlock;
            MemBlock *used = new MemBlock;
            used->start = bestFit->start;
            used->length = mem;
            free->start = used->start + used->length;
            free->length = bestFit->start + bestFit->length - free->start;
            // 将两份分别添加到对应区域
            freeMemBlockList.push_back(free);
            usedMemBlockList.push_back(used);
            // 删除原来的内存块
            delete bestFit;
            // 创建一个新的进程描述
            Process *process = new Process;
            process->pid = getNewPid();
            strcpy(process->name, name);
            process->memBlock = used;
            // 将进程描述添加到进程表中
            processList.push_back(process);
        }
    } else {
        cout << "can't create new process, reason: no enough mem" << endl;
    }
}